

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O0

bool iDynTree::doubleToStringWithClassicLocale(double *inDouble,string *outStr)

{
  uint uVar1;
  int iVar2;
  string *in_RSI;
  double *in_RDI;
  int str_len;
  char buf [25];
  char local_38 [32];
  string *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_18 = in_RSI;
  uVar1 = std::isnan(*in_RDI);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isinf(*in_RDI), (uVar1 & 1) == 0)) {
    iVar2 = idyntree_private_fpconv_dtoa
                      ((double)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (char *)in_RDI);
    local_38[iVar2] = '\0';
    std::__cxx11::string::operator=(local_18,local_38);
    return true;
  }
  return false;
}

Assistant:

bool inline doubleToStringWithClassicLocale(const double & inDouble, std::string& outStr)
{
    if (std::isnan(inDouble) || std::isinf(inDouble)) {
        return false;
    }

    // fpconv returns nul-terminated strings, that can be converted directly to C++ std::string
    // see https://github.com/night-shift/fpconv/tree/4a087d1b2df765baa409536931916a2c082cdda4#example-usage
    char buf[24 + 1];
    int str_len = idyntree_private_fpconv_dtoa(inDouble, buf);
    buf[str_len] = '\0';
    outStr = buf;
    return true;
}